

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

ostream * operator<<(ostream *o,Employee *e)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  Address *a;
  Employee *e_local;
  ostream *o_local;
  
  poVar2 = std::operator<<(o,"name-> ");
  psVar3 = Person::getName_abi_cxx11_(&e->super_Person);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,", id-> ");
  psVar3 = Person::getId_abi_cxx11_(&e->super_Person);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,", address-> ");
  a = Person::getAddress(&e->super_Person);
  poVar2 = operator<<(poVar2,a);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"hour work= ");
  iVar1 = Employee::getHourWork(e);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", salary per hour= ");
  iVar1 = Employee::getSalaryPerHour(e);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", work to do= ");
  iVar1 = Employee::getWorkToDo(e);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", work done= ");
  iVar1 = Employee::getWorkDone(e);
  std::ostream::operator<<(poVar2,iVar1);
  return o;
}

Assistant:

std::ostream &operator<<(ostream &o, const Employee &e) {

    o << "name-> " << e.getName() << ", id-> " << e.getId() << ", address-> " << e.getAddress() << endl
        << "hour work= " << e.getHourWork() << ", salary per hour= " << e.getSalaryPerHour() << ", work to do= " << e.getWorkToDo() << ", work done= " << e.getWorkDone();
    return o;
}